

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# requantize.cpp
# Opt level: O2

int __thiscall ncnn::Requantize::load_model(Requantize *this,ModelBin *mb)

{
  Mat MStack_58;
  
  if (this->bias_term != 0) {
    (*mb->_vptr_ModelBin[2])(&MStack_58,mb,(ulong)(uint)this->bias_data_size,1);
    Mat::operator=(&this->bias_data,&MStack_58);
    Mat::~Mat(&MStack_58);
    if ((this->bias_data).data == (void *)0x0) {
      return -100;
    }
    if ((long)(this->bias_data).c * (this->bias_data).cstep == 0) {
      return -100;
    }
  }
  return 0;
}

Assistant:

int Requantize::load_model(const ModelBin& mb)
{
    if (bias_term)
    {
        bias_data = mb.load(bias_data_size, 1);
        if (bias_data.empty())
            return -100;
    }

    return 0;
}